

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Vector3 Vector3RotateByAxisAngle(Vector3 v,Vector3 axis,float angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vector3 VVar10;
  undefined4 local_18;
  undefined4 uStack_14;
  
  fVar6 = axis.z;
  fVar4 = axis.x;
  fVar5 = axis.y;
  fVar3 = v.z;
  fVar1 = fVar6 * fVar6 + fVar4 * fVar4 + fVar5 * fVar5;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = (float)(-(uint)(fVar1 == 0.0) & 0x3f800000 | ~-(uint)(fVar1 == 0.0) & (uint)(1.0 / fVar1))
  ;
  fVar2 = sinf(angle * 0.5);
  fVar4 = fVar4 * fVar1 * fVar2;
  fVar5 = fVar5 * fVar1 * fVar2;
  fVar2 = fVar1 * fVar6 * fVar2;
  fVar1 = cosf(angle * 0.5);
  local_18 = v.x;
  uStack_14 = v.y;
  fVar8 = fVar2 * local_18 - fVar4 * fVar3;
  fVar6 = fVar4 * uStack_14 - local_18 * fVar5;
  fVar1 = fVar1 + fVar1;
  fVar7 = fVar5 * fVar3 - uStack_14 * fVar2;
  fVar9 = fVar5 * fVar6 - fVar8 * fVar2;
  fVar2 = fVar2 * fVar7 - fVar6 * fVar4;
  fVar4 = fVar4 * fVar8 - fVar7 * fVar5;
  VVar10.z = fVar6 * fVar1 + fVar3 + fVar4 + fVar4;
  VVar10.y = fVar8 * fVar1 + uStack_14 + fVar2 + fVar2;
  VVar10.x = fVar7 * fVar1 + local_18 + fVar9 + fVar9;
  return VVar10;
}

Assistant:

RMAPI Vector3 Vector3RotateByAxisAngle(Vector3 v, Vector3 axis, float angle)
{
    // Using Euler-Rodrigues Formula
    // Ref.: https://en.wikipedia.org/w/index.php?title=Euler%E2%80%93Rodrigues_formula

    Vector3 result = v;

    // Vector3Normalize(axis);
    float length = sqrtf(axis.x*axis.x + axis.y*axis.y + axis.z*axis.z);
    if (length == 0.0f) length = 1.0f;
    float ilength = 1.0f/length;
    axis.x *= ilength;
    axis.y *= ilength;
    axis.z *= ilength;

    angle /= 2.0f;
    float a = sinf(angle);
    float b = axis.x*a;
    float c = axis.y*a;
    float d = axis.z*a;
    a = cosf(angle);
    Vector3 w = { b, c, d };

    // Vector3CrossProduct(w, v)
    Vector3 wv = { w.y*v.z - w.z*v.y, w.z*v.x - w.x*v.z, w.x*v.y - w.y*v.x };

    // Vector3CrossProduct(w, wv)
    Vector3 wwv = { w.y*wv.z - w.z*wv.y, w.z*wv.x - w.x*wv.z, w.x*wv.y - w.y*wv.x };

    // Vector3Scale(wv, 2*a)
    a *= 2;
    wv.x *= a;
    wv.y *= a;
    wv.z *= a;

    // Vector3Scale(wwv, 2)
    wwv.x *= 2;
    wwv.y *= 2;
    wwv.z *= 2;

    result.x += wv.x;
    result.y += wv.y;
    result.z += wv.z;

    result.x += wwv.x;
    result.y += wwv.y;
    result.z += wwv.z;

    return result;
}